

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O3

void __thiscall maths::Matrix::readSolutionsFromRREF(Matrix *this,ostream *os)

{
  uint uVar1;
  int rows;
  char cVar2;
  long *plVar3;
  ostream *poVar4;
  double *pdVar5;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  double **ppdVar9;
  bool bVar10;
  int iVar11;
  long lVar12;
  double dVar13;
  Matrix special;
  Matrix particular;
  Matrix R;
  Matrix local_70;
  Matrix local_60;
  Matrix local_50;
  Matrix local_40;
  
  Matrix(&local_50,this);
  cVar2 = (char)os;
  if (0 < this->rows_) {
    uVar1 = this->cols_ - 1;
    lVar12 = 0;
    iVar11 = this->rows_;
    do {
      if (this->cols_ < 2) {
LAB_00123349:
        dVar13 = local_50.p[lVar12][(int)uVar1];
        if ((dVar13 != 0.0) || (NAN(dVar13))) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"NO SOLUTIONS",0xc);
          std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
          std::ostream::put(cVar2);
          plVar3 = (long *)std::ostream::flush();
          std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
          std::ostream::put((char)plVar3);
          std::ostream::flush();
          goto LAB_0012368c;
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"INFINITE SOLUTIONS",0x12);
        std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
        std::ostream::put(cVar2);
        plVar3 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
LAB_00123475:
        std::ostream::put((char)plVar3);
        std::ostream::flush();
        goto LAB_00123488;
      }
      bVar6 = true;
      uVar7 = 0;
      do {
        bVar6 = (bool)(bVar6 & local_50.p[lVar12][uVar7] == 0.0);
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
      if (bVar6) goto LAB_00123349;
      if (iVar11 < (int)uVar1) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"INFINITE SOLUTIONS",0x12);
        std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
        std::ostream::put(cVar2);
        plVar3 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
        goto LAB_00123475;
      }
      lVar12 = lVar12 + 1;
      iVar11 = this->rows_;
    } while (lVar12 < this->rows_);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"UNIQUE SOLUTION",0xf);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
LAB_00123488:
  Matrix(&local_60,this->cols_ + -1,1);
  Matrix(&local_70,this->cols_ + -1,1);
  if (0 < this->rows_) {
    lVar12 = 0;
    do {
      iVar11 = this->cols_;
      if (1 < iVar11) {
        rows = iVar11 + -1;
        pdVar5 = local_50.p[lVar12];
        lVar8 = 0;
        bVar6 = false;
        bVar10 = false;
        do {
          if ((pdVar5[lVar8] != 0.0) || (NAN(pdVar5[lVar8]))) {
            if (bVar10) {
              if (!bVar6) {
                Matrix(&local_40,rows,1);
                operator=(&local_70,&local_40);
                ~Matrix(&local_40);
                pdVar5 = local_50.p[lVar12];
                iVar11 = this->cols_;
              }
              dVar13 = -pdVar5[lVar8];
              bVar6 = true;
              ppdVar9 = local_70.p;
            }
            else {
              dVar13 = pdVar5[rows];
              ppdVar9 = local_60.p;
            }
            *ppdVar9[lVar8] = dVar13;
            bVar10 = true;
          }
          lVar8 = lVar8 + 1;
          rows = iVar11 + -1;
        } while (lVar8 < rows);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"Special solution:",0x11);
      std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
      std::ostream::put(cVar2);
      poVar4 = (ostream *)std::ostream::flush();
      operator<<(poVar4,&local_70);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      lVar12 = lVar12 + 1;
    } while (lVar12 < this->rows_);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"Particular solution:",0x14);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  poVar4 = (ostream *)std::ostream::flush();
  operator<<(poVar4,&local_60);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  ~Matrix(&local_70);
  ~Matrix(&local_60);
LAB_0012368c:
  ~Matrix(&local_50);
  return;
}

Assistant:

void Matrix::readSolutionsFromRREF(ostream& os)
{
    Matrix R(*this);

    // print number of solutions
    bool hasSolutions = true;
    bool doneSearching = false;
    int i = 0;
    while (!doneSearching && i < rows_)
    {
        bool allZeros = true;
        for (int j = 0; j < cols_ - 1; ++j) {
            if (R(i, j) != 0)
                allZeros = false;
        }
        if (allZeros && R(i, cols_ - 1) != 0) {
            hasSolutions = false;
            os << "NO SOLUTIONS" << endl << endl;
            doneSearching = true;
        } else if (allZeros && R(i, cols_ - 1) == 0) {
            os << "INFINITE SOLUTIONS" << endl << endl;
            doneSearching = true;
        } else if (rows_ < cols_ - 1) {
            os << "INFINITE SOLUTIONS" << endl << endl;
            doneSearching = true;
        }
        i++;
    }
    if (!doneSearching)
        os << "UNIQUE SOLUTION" << endl << endl;

    // get solutions if they exist
    if (hasSolutions)
    {
        Matrix particular(cols_ - 1, 1);
        Matrix special(cols_ - 1, 1);

        for (int i = 0; i < rows_; ++i) {
            bool pivotFound = false;
            bool specialCreated = false;
            for (int j = 0; j < cols_ - 1; ++j) {
                if (R(i, j) != 0) {
                    // if pivot variable, add b to particular
                    if (!pivotFound) {
                        pivotFound = true;
                        particular(j, 0) = R(i, cols_ - 1);
                    } else { // otherwise, add to special solution
                        if (!specialCreated) {
                            special = Matrix(cols_ - 1, 1);
                            specialCreated = true;
                        }
                        special(j, 0) = -1 * R(i, j);
                    }
                }
            }
            os << "Special solution:" << endl << special << endl;
        }
        os << "Particular solution:" << endl << particular << endl;
    }
}